

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.h
# Opt level: O0

void __thiscall z80::z80(z80 *this,OpCode o,Operand *o1,Operand *o2)

{
  string local_48;
  Operand *local_28;
  Operand *o2_local;
  Operand *o1_local;
  z80 *pzStack_10;
  OpCode o_local;
  z80 *this_local;
  
  local_28 = o2;
  o2_local = o1;
  o1_local._4_4_ = o;
  pzStack_10 = this;
  to_string_abi_cxx11_(&local_48,(z80 *)(ulong)o,(OpCode)o1);
  ASMLine::ASMLine(&this->super_ASMLine,Instruction,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this->opcode = o1_local._4_4_;
  Operand::Operand(&this->op1,o1);
  Operand::Operand(&this->op2,o2);
  std::__cxx11::string::string((string *)&this->comment);
  return;
}

Assistant:

z80(const OpCode o, const Operand o1, const Operand o2)
	: ASMLine(Type::Instruction, to_string(o))
		, opcode(o), op1(o1), op2(o2)
	{}